

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::SerializationException::SerializationException<char_const*>
          (SerializationException *this,string *msg,char *params)

{
  char *in_RCX;
  string local_30;
  
  Exception::ConstructMessage<char_const*>(&local_30,(Exception *)msg,(string *)params,in_RCX);
  SerializationException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}